

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares.c
# Opt level: O3

uint64_t aom_sum_squares_2d_i16_c(int16_t *src,int src_stride,int width,int height)

{
  uint64_t uVar1;
  int iVar2;
  ulong uVar3;
  
  iVar2 = 0;
  if (0 < height) {
    uVar1 = 0;
    do {
      if (0 < width) {
        uVar3 = 0;
        do {
          uVar1 = uVar1 + (uint)((int)src[uVar3] * (int)src[uVar3]);
          uVar3 = uVar3 + 1;
        } while ((uint)width != uVar3);
      }
      iVar2 = iVar2 + 1;
      src = src + src_stride;
    } while (iVar2 != height);
    return uVar1;
  }
  return 0;
}

Assistant:

uint64_t aom_sum_squares_2d_i16_c(const int16_t *src, int src_stride, int width,
                                  int height) {
  int r, c;
  uint64_t ss = 0;

  for (r = 0; r < height; r++) {
    for (c = 0; c < width; c++) {
      const int16_t v = src[c];
      ss += v * v;
    }
    src += src_stride;
  }

  return ss;
}